

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O0

sexp_conflict
sexp_ioctl_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
               sexp_conflict arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res2;
  sexp_conflict res;
  winsize *tmp2;
  int err;
  ulong local_98;
  ulong local_90;
  int local_80;
  int local_78;
  int local_70;
  int local_68;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  sexp_conflict local_48;
  void *local_40;
  int local_34;
  int *local_30;
  int *local_28;
  long local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_34 = 0;
  local_50 = 0x43e;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_60,0,0x10);
  if ((((((ulong)local_28 & 3) == 0) && (*local_28 == 0x10)) ||
      ((((ulong)local_28 & 3) == 0 && (*local_28 == 0x11)))) ||
     (((((ulong)local_28 & 3) == 0 && (*local_28 == 0x12)) || (((ulong)local_28 & 1) == 1)))) {
    if ((((ulong)local_30 & 1) == 1) || ((((ulong)local_30 & 3) == 0 && (*local_30 == 0xc)))) {
      local_60 = &local_50;
      local_58 = *(undefined8 *)(local_10 + 0x6080);
      *(undefined8 ***)(local_10 + 0x6080) = &local_60;
      local_40 = calloc(1,9);
      if (((((ulong)local_28 & 3) == 0) && (*local_28 == 0x10)) ||
         ((((ulong)local_28 & 3) == 0 && (*local_28 == 0x11)))) {
        if (*(long *)(local_28 + 8) == 0) {
          if (((*(ulong *)(local_28 + 6) & 3) == 0) && (**(int **)(local_28 + 6) == 0x12)) {
            local_70 = (int)*(undefined8 *)(*(long *)(local_28 + 6) + 0x10);
          }
          else {
            local_70 = -1;
          }
          local_68 = local_70;
        }
        else {
          local_68 = fileno(*(FILE **)(local_28 + 8));
        }
        local_78 = local_68;
      }
      else {
        if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0x12)) {
          local_80 = (int)*(undefined8 *)(local_28 + 4);
        }
        else {
          auVar1._8_8_ = (long)local_28 >> 0x3f;
          auVar1._0_8_ = (ulong)local_28 & 0xfffffffffffffffe;
          local_80 = SUB164(auVar1 / SEXT816(2),0);
        }
        local_78 = local_80;
      }
      if (((ulong)local_30 & 1) == 1) {
        auVar2._8_8_ = (long)local_30 >> 0x3f;
        auVar2._0_8_ = (ulong)local_30 & 0xfffffffffffffffe;
        local_90 = SUB168(auVar2 / SEXT816(2),0);
      }
      else {
        if ((((ulong)local_30 & 3) == 0) && (*local_30 == 0xc)) {
          local_98 = *(ulong *)(local_30 + 6);
        }
        else {
          local_98 = 0;
        }
        local_90 = local_98;
      }
      local_34 = ioctl(local_78,local_90,local_40);
      if (local_34 == 0) {
        auVar3._8_8_ = (long)*(ulong *)(local_18 + 0x40) >> 0x3f;
        auVar3._0_8_ = *(ulong *)(local_18 + 0x40) & 0xfffffffffffffffe;
        local_48 = (sexp_conflict)
                   sexp_make_cpointer(local_10,SUB168(auVar3 / SEXT816(2),0),local_40,0x3e,1);
      }
      else {
        local_48 = (sexp_conflict)0x3e;
      }
      *(undefined8 *)(local_10 + 0x6080) = local_58;
      local_8 = local_48;
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,2,local_30);
    }
  }
  else {
    local_8 = (sexp_conflict)
              sexp_xtype_exception(local_10,local_18,"not a port or file descriptor",local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_ioctl_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int err = 0;
  struct winsize* tmp2;
  sexp res;
  sexp_gc_var1(res2);
  if (! (sexp_portp(arg0) || sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_xtype_exception(ctx, self, "not a port or file descriptor",arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  sexp_gc_preserve1(ctx, res2);
  tmp2 = (struct winsize*) calloc(1, 1 + sizeof(tmp2[0]));
  err = ioctl((sexp_portp(arg0) ? sexp_port_fileno(arg0) : sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), sexp_uint_value(arg1), tmp2);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res2 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg3_type(self)), tmp2, SEXP_FALSE, 1);
  res = res2;
  }
  sexp_gc_release1(ctx);
  return res;
}